

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTest::createInstance
          (AdvGraphicsTest *this,Context *context)

{
  undefined1 *puVar1;
  bool inRenderPass;
  VkPipeline obj;
  VkAllocationCallbacks *pVVar2;
  Handle<(vk::HandleType)18> HVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  BasicGraphicsTestInstance *this_00;
  VkPhysicalDeviceFeatures *__src;
  DeviceInterface *vkd;
  VkDevice device;
  char *entry_name;
  Move<vk::Handle<(vk::HandleType)18>_> local_a8;
  deUint64 local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_68;
  vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_> local_50;
  UVec2 local_38;
  
  this_00 = (BasicGraphicsTestInstance *)operator_new(0x5e8);
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&local_68,&(this->super_BasicGraphicsTest).super_TimestampTest.m_stages);
  inRenderPass = (this->super_BasicGraphicsTest).super_TimestampTest.m_inRenderPass;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&local_50,&local_68);
  entry_name = (char *)(ulong)inRenderPass;
  BasicGraphicsTestInstance::BasicGraphicsTestInstance(this_00,context,&local_50,inRenderPass);
  if (local_50.
      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this_00->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__AdvGraphicsTestInstance_00d26ce8;
  this_00[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  puVar1 = &this_00[1].m_colorImageAlloc.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8;
  *(undefined8 *)
   &this_00[1].m_colorImageAlloc.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8 = 0;
  this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  __src = Context::getDeviceFeatures
                    ((this_00->super_TimestampTestInstance).super_TestInstance.m_context);
  memcpy(this_00 + 1,__src,0xdc);
  (*(this_00->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[8])(this_00);
  if (*(int *)&this_00[1].super_TimestampTestInstance.m_stages.
               super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
               ._M_impl.super__Vector_impl_data._M_start == 1) {
    SimpleGraphicsPipelineBuilder::bindShaderStage
              (&this_00->m_pipelineBuilder,VK_SHADER_STAGE_GEOMETRY_BIT,"dummy_geo",entry_name);
  }
  if (*(int *)((long)&this_00[1].super_TimestampTestInstance.m_stages.
                      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) == 1) {
    SimpleGraphicsPipelineBuilder::bindShaderStage
              (&this_00->m_pipelineBuilder,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,"basic_tcs",
               entry_name);
    SimpleGraphicsPipelineBuilder::bindShaderStage
              (&this_00->m_pipelineBuilder,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,"basic_tes",
               entry_name);
    (this_00->m_pipelineBuilder).m_patchControlPoints = 3;
  }
  local_38.m_data = *&(this_00->m_renderSize).m_data;
  SimpleGraphicsPipelineBuilder::buildPipeline
            (&local_a8,&this_00->m_pipelineBuilder,&local_38,
             (VkRenderPass)
             (this_00->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal);
  pVVar2 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar5 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar4 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_78 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pVStack_70 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_88 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  pDStack_80 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_device = pVVar5;
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_allocator = pVVar2;
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
    m_internal = HVar3.m_internal;
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data
                .deleter,obj);
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_device = local_78;
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_allocator = pVStack_70;
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
    m_internal = local_88;
    (this_00->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = pDStack_80;
    if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  vkd = Context::getDeviceInterface
                  ((this_00->super_TimestampTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this_00->super_TimestampTestInstance).super_TestInstance.m_context);
  *(uint *)((long)&this_00[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                   deleter.m_device + 4) =
       (*(int *)((long)&this_00[1].super_TimestampTestInstance.m_stages.
                        super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 1) + 1;
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&local_a8,(TimestampTestInstance *)this_00,0x20
             ,0x100,(MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                    &this_00[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                     deleter.m_allocator);
  pVVar2 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar5 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar4 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_78 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pVStack_70 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_88 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  pDStack_80 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*(deUint64 *)puVar1 == 0) {
    this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pVVar5;
    this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)pVVar2;
    *(deUint64 *)puVar1 = HVar3.m_internal;
    this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         (deUint64)pDVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&this_00[1].m_depthImage,
               (VkBuffer)*(deUint64 *)puVar1);
    this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_78;
    this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)pVStack_70;
    *(deUint64 *)puVar1 = local_88;
    this_00[1].m_depthImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         (deUint64)pDStack_80;
    if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
                 &local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkBuffer)
                 local_a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  memcpy((this_00[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
         m_allocator)->pfnFree,&DAT_00addbd0,
         (ulong)*(uint *)((long)&this_00[1].m_colorImage.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                                 m_device + 4) << 4);
  pVVar2 = this_00[1].m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
           m_allocator;
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)pVVar2->pfnAllocation,(VkDeviceSize)pVVar2->pfnReallocation,
             0x20);
  if (local_68.
      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* AdvGraphicsTest::createInstance(Context& context) const
{
	return new AdvGraphicsTestInstance(context,m_stages,m_inRenderPass);
}